

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void enableCursor(_GLFWwindow *window)

{
  double in_RDI;
  _GLFWwindow *unaff_retaddr;
  uchar mask [1];
  XIEventMask em;
  uchar local_19 [9];
  uchar *in_stack_fffffffffffffff0;
  
  if (_glfw.x11.xi.available != 0) {
    memset(local_19,0,1);
    local_19[1] = '\x01';
    local_19[2] = '\0';
    local_19[3] = '\0';
    local_19[4] = '\0';
    local_19[5] = '\x01';
    local_19[6] = '\0';
    local_19[7] = '\0';
    local_19[8] = '\0';
    in_stack_fffffffffffffff0 = local_19;
    (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,(XIEventMask *)(local_19 + 1),1);
  }
  _glfw.x11.disabledCursorWindow = (_GLFWwindow *)0x0;
  XUngrabPointer(_glfw.x11.display,0);
  _glfwPlatformSetCursorPos(unaff_retaddr,in_RDI,(double)in_stack_fffffffffffffff0);
  updateCursorImage((_GLFWwindow *)0x1da135);
  return;
}

Assistant:

static void enableCursor(_GLFWwindow* window)
{
    if (_glfw.x11.xi.available)
    {
        XIEventMask em;
        unsigned char mask[] = { 0 };

        em.deviceid = XIAllMasterDevices;
        em.mask_len = sizeof(mask);
        em.mask = mask;

        XISelectEvents(_glfw.x11.display, _glfw.x11.root, &em, 1);
    }

    _glfw.x11.disabledCursorWindow = NULL;
    XUngrabPointer(_glfw.x11.display, CurrentTime);
    _glfwPlatformSetCursorPos(window,
                              _glfw.x11.restoreCursorPosX,
                              _glfw.x11.restoreCursorPosY);
    updateCursorImage(window);
}